

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O2

void __thiscall
asio::detail::reactive_socket_service<asio::ip::udp>::
async_receive_from<asio::mutable_buffers_1,ableton::util::SafeAsyncHandler<ableton::platforms::asio::Socket<512ul>::Impl>>
          (reactive_socket_service<asio::ip::udp> *this,implementation_type *impl,
          mutable_buffers_1 *buffers,endpoint_type *sender_endpoint,message_flags flags,
          SafeAsyncHandler<ableton::platforms::asio::Socket<512UL>::Impl> *handler)

{
  reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_ableton::util::SafeAsyncHandler<ableton::platforms::asio::Socket<512UL>::Impl>_>
  *this_00;
  ptr local_50;
  reactive_socket_service_base *local_38;
  
  local_50.h = handler;
  local_38 = &this->super_reactive_socket_service_base;
  this_00 = reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_ableton::util::SafeAsyncHandler<ableton::platforms::asio::Socket<512UL>::Impl>_>
            ::ptr::allocate(handler);
  local_50.p = (reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_ableton::util::SafeAsyncHandler<ableton::platforms::asio::Socket<512UL>::Impl>_>
                *)0x0;
  local_50.v = this_00;
  reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_ableton::util::SafeAsyncHandler<ableton::platforms::asio::Socket<512UL>::Impl>_>
  ::reactive_socket_recvfrom_op
            (this_00,(impl->super_base_implementation_type).socket_,2,buffers,sender_endpoint,flags,
             handler);
  local_50.p = this_00;
  reactive_socket_service_base::start_op
            (local_38,&impl->super_base_implementation_type,flags * 2 & 2,(reactor_op *)this_00,
             false,true,false);
  local_50.v = (reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_ableton::util::SafeAsyncHandler<ableton::platforms::asio::Socket<512UL>::Impl>_>
                *)0x0;
  local_50.p = (reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_ableton::util::SafeAsyncHandler<ableton::platforms::asio::Socket<512UL>::Impl>_>
                *)0x0;
  reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_ableton::util::SafeAsyncHandler<ableton::platforms::asio::Socket<512UL>::Impl>_>
  ::ptr::~ptr(&local_50);
  return;
}

Assistant:

void async_receive_from(implementation_type& impl,
      const MutableBufferSequence& buffers, endpoint_type& sender_endpoint,
      socket_base::message_flags flags, Handler& handler)
  {
    bool is_continuation =
      asio_handler_cont_helpers::is_continuation(handler);

    // Allocate and construct an operation to wrap the handler.
    typedef reactive_socket_recvfrom_op<MutableBufferSequence,
        endpoint_type, Handler> op;
    typename op::ptr p = { asio::detail::addressof(handler),
      op::ptr::allocate(handler), 0 };
    int protocol = impl.protocol_.type();
    p.p = new (p.v) op(impl.socket_, protocol,
        buffers, sender_endpoint, flags, handler);

    ASIO_HANDLER_CREATION((reactor_.context(), *p.p, "socket",
          &impl, impl.socket_, "async_receive_from"));

    start_op(impl,
        (flags & socket_base::message_out_of_band)
          ? reactor::except_op : reactor::read_op,
        p.p, is_continuation, true, false);
    p.v = p.p = 0;
  }